

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O1

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
S2Builder::Graph::PolylineBuilder::BuildWalks
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,PolylineBuilder *this)

{
  btree_map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256> *this_00;
  pointer piVar1;
  pointer piVar2;
  pointer pvVar3;
  _Bit_type *p_Var4;
  pointer piVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  ulong uVar9;
  pointer piVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  EdgePolyline *polyline;
  pointer polyline_00;
  ulong uVar14;
  ulong uVar15;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range2;
  VertexId v;
  EdgePolyline polyline_1;
  vector<int,_std::allocator<int>_> edges;
  int local_80;
  int local_7c;
  pointer local_78;
  ulong local_70;
  EdgePolyline local_68;
  vector<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = &this->min_input_ids_;
  GetInputEdgeOrder(&local_50,(Graph *)this,local_38);
  piVar5 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    this_00 = &this->excess_used_;
    piVar10 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    do {
      uVar6 = (ulong)*piVar10;
      uVar8 = uVar6 + 0x3f;
      if (-1 < (long)uVar6) {
        uVar8 = uVar6;
      }
      if (((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
           ._M_start.super__Bit_iterator_base._M_p
           [((long)uVar8 >> 6) +
            (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar6 & 0x3f) & 1) == 0) {
        local_80 = (this->g_->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar6].first;
        if (this->directed_ == true) {
          piVar1 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          piVar2 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar13 = (piVar2[(long)local_80 + 1] + piVar1[local_80]) -
                   (piVar2[local_80] + piVar1[(long)local_80 + 1]);
        }
        else {
          piVar1 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar13 = (piVar1[(long)local_80 + 1] - piVar1[local_80]) % 2;
        }
        if (0 < iVar13) {
          pmVar7 = gtl::internal_btree::
                   btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   ::operator[](&this_00->
                                 super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                ,&local_80);
          if (this->directed_ == true) {
            if (0 < iVar13 - *pmVar7) {
LAB_001c46ac:
              pmVar7 = gtl::internal_btree::
                       btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                       ::operator[](&this_00->
                                     super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                    ,&local_80);
              *pmVar7 = *pmVar7 + 1;
              BuildWalk(&local_68,this,local_80);
              std::
              vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              ::emplace_back<std::vector<int,std::allocator<int>>>
                        ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                          *)__return_storage_ptr__,&local_68);
              if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pmVar7 = gtl::internal_btree::
                       btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                       ::operator[](&this_00->
                                     super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                    ,&(this->g_->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start
                                      [(__return_storage_ptr__->
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish[-1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish[-1]].second);
              *pmVar7 = *pmVar7 + -1;
            }
          }
          else if ((iVar13 - *pmVar7 & 1U) != 0) goto LAB_001c46ac;
        }
      }
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar5);
  }
  if (0 < this->edges_left_) {
    pvVar3 = (__return_storage_ptr__->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (polyline_00 = (__return_storage_ptr__->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; polyline_00 != pvVar3;
        polyline_00 = polyline_00 + 1) {
      MaximizeWalk(this,polyline_00);
    }
  }
  iVar13 = this->edges_left_;
  if (0 < iVar13 &&
      (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    uVar8 = (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    uVar6 = 0;
    local_70 = 0x800000000000003f;
    do {
      uVar11 = (ulong)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6];
      p_Var4 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar9 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar9 = uVar11;
      }
      if ((p_Var4[((long)uVar9 >> 6) +
                  (ulong)((uVar11 & local_70) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar11 & 0x3f) & 1) == 0) {
        local_78 = (this->g_->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        iVar13 = local_78[uVar11].first;
        if (uVar6 < uVar8) {
          piVar5 = (this->min_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar12 = 0;
          uVar9 = uVar6;
          do {
            uVar14 = (ulong)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar9];
            if (piVar5[uVar14] != piVar5[uVar11]) break;
            uVar15 = uVar14 + 0x3f;
            if (-1 < (long)uVar14) {
              uVar15 = uVar14;
            }
            if ((p_Var4[((long)uVar15 >> 6) +
                        (ulong)((uVar14 & local_70) < 0x8000000000000001) + 0xffffffffffffffff] >>
                 (uVar14 & 0x3f) & 1) == 0) {
              iVar12 = (iVar12 + (uint)(local_78[uVar14].first == iVar13)) -
                       (uint)(local_78[uVar14].second == iVar13);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar8);
          local_7c = iVar13;
          if (iVar12 != 1) goto LAB_001c48b4;
        }
        else {
LAB_001c48b4:
          if (local_78[uVar11].second != iVar13) goto LAB_001c47d5;
        }
        BuildWalk(&local_68,this,iVar13);
        MaximizeWalk(this,&local_68);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)__return_storage_ptr__,&local_68);
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
LAB_001c47d5:
      uVar6 = uVar6 + 1;
      uVar8 = (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      iVar13 = this->edges_left_;
    } while ((uVar6 < uVar8) && (0 < iVar13));
  }
  if (iVar13 != 0) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
               ,0x30b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,"Check failed: (0) == (edges_left_) ",0x23);
    abort();
  }
  CanonicalizeVectorOrder(local_38,__return_storage_ptr__);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Graph::EdgePolyline> Graph::PolylineBuilder::BuildWalks() {
  // Note that some of this code is worst-case quadratic in the maximum vertex
  // degree.  This could be fixed with a few extra arrays, but it should not
  // be a problem in practice.

  // First, build polylines from all vertices where outdegree > indegree (or
  // for undirected edges, vertices whose degree is odd).  We consider the
  // possible starting edges in input edge id order, for idempotency in the
  // case where multiple input polylines share vertices or edges.
  vector<EdgePolyline> polylines;
  vector<EdgeId> edges = g_.GetInputEdgeOrder(min_input_ids_);
  for (EdgeId e : edges) {
    if (used_[e]) continue;
    VertexId v = g_.edge(e).first;
    int excess = excess_degree(v);
    if (excess <= 0) continue;
    excess -= excess_used_[v];
    if (directed_ ? (excess <= 0) : (excess % 2 == 0)) continue;
    ++excess_used_[v];
    polylines.push_back(BuildWalk(v));
    --excess_used_[g_.edge(polylines.back().back()).second];
  }
  // Now all vertices have outdegree == indegree (or even degree if undirected
  // edges are being used).  Therefore all remaining edges can be assembled
  // into loops.  We first try to expand the existing polylines if possible by
  // adding loops to them.
  if (edges_left_ > 0) {
    for (EdgePolyline& polyline : polylines) {
      MaximizeWalk(&polyline);
    }
  }
  // Finally, if there are still unused edges then we build loops.  If the
  // input is a polyline that forms a loop, then for idempotency we need to
  // start from the edge with minimum input edge id.  If the minimal input
  // edge was split into several edges, then we start from the first edge of
  // the chain.
  for (int i = 0; i < edges.size() && edges_left_ > 0; ++i) {
    EdgeId e = edges[i];
    if (used_[e]) continue;

    // Determine whether the origin of this edge is the start of an edge
    // chain.  To do this, we test whether (outdegree - indegree == 1) for the
    // origin, considering only unused edges with the same minimum input edge
    // id.  (Undirected edges have input edge ids in one direction only.)
    VertexId v = g_.edge(e).first;
    InputEdgeId id = min_input_ids_[e];
    int excess = 0;
    for (int j = i; j < edges.size() && min_input_ids_[edges[j]] == id; ++j) {
      EdgeId e2 = edges[j];
      if (used_[e2]) continue;
      if (g_.edge(e2).first == v) ++excess;
      if (g_.edge(e2).second == v) --excess;
    }
    // It is also acceptable to start a polyline from any degenerate edge.
    if (excess == 1 || g_.edge(e).second == v) {
      EdgePolyline polyline = BuildWalk(v);
      MaximizeWalk(&polyline);
      polylines.push_back(std::move(polyline));
    }
  }
  S2_DCHECK_EQ(0, edges_left_);

  // Sort the polylines to correspond to the input order (if possible).
  CanonicalizeVectorOrder(min_input_ids_, &polylines);
  return polylines;
}